

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8to1.h
# Opt level: O1

void ncnn::conv3x3s1_pack8to1_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  void *pvVar16;
  void *pvVar17;
  ulong uVar18;
  size_t sVar19;
  size_t sVar20;
  void *pvVar21;
  void *pvVar22;
  float fVar23;
  undefined1 auVar24 [16];
  uint uVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  void *pvVar39;
  long lVar40;
  undefined1 (*pauVar41) [32];
  long lVar42;
  void *pvVar43;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar44 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  float fVar52;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar53 [64];
  undefined1 auVar60 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 in_ZMM5 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  int size;
  undefined1 auVar61 [64];
  
  iVar12 = top_blob->c;
  if (0 < (long)iVar12) {
    uVar13 = bottom_blob->c;
    iVar14 = top_blob->w;
    uVar15 = top_blob->h;
    pvVar16 = _bias->data;
    lVar30 = (long)top_blob->h * (long)top_blob->w;
    pvVar17 = top_blob->data;
    uVar18 = top_blob->elemsize;
    lVar27 = top_blob->cstep * uVar18;
    lVar42 = 0;
    iVar38 = (int)((uVar18 * lVar30 + 0xf & 0xfffffffffffffff0) / uVar18);
    if (top_blob->dims == 4) {
      iVar38 = (int)lVar30;
    }
    uVar26 = iVar38 * top_blob->d;
    sVar19 = kernel->cstep;
    sVar20 = kernel->elemsize;
    pvVar21 = kernel->data;
    pvVar22 = bottom_blob->data;
    lVar30 = bottom_blob->cstep * bottom_blob->elemsize;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = (ulong)uVar26 - 1;
    auVar24 = vpshufd_avx(auVar44,0x44);
    lVar35 = (long)bottom_blob->w * bottom_blob->elemsize;
    auVar51 = ZEXT3264(_DAT_0054fc80);
    auVar53 = ZEXT3264(_DAT_0054fca0);
    uVar18 = auVar24._0_8_;
    auVar60._0_8_ = uVar18 ^ 0x8000000000000000;
    auVar60._8_4_ = auVar24._8_4_;
    uVar25 = auVar24._12_4_;
    auVar60._12_4_ = uVar25 ^ 0x80000000;
    auVar44 = vpcmpeqd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_);
    pvVar39 = pvVar17;
    do {
      auVar64 = ZEXT1664(auVar44);
      auVar61 = ZEXT1664(auVar60);
      auVar48 = ZEXT3264(CONCAT1616(auVar24,auVar24));
      if (pvVar16 == (void *)0x0) {
        auVar67 = ZEXT816(0) << 0x40;
      }
      else {
        auVar67 = ZEXT416(*(uint *)((long)pvVar16 + lVar42 * 4));
      }
      if (0 < (int)uVar26) {
        auVar67 = vshufps_avx(auVar67,auVar67,0);
        auVar68._16_16_ = auVar67;
        auVar68._0_16_ = auVar67;
        uVar28 = 0;
        do {
          auVar67._8_8_ = 0;
          auVar67._0_8_ = uVar28;
          auVar67 = vpshufd_avx(auVar67,0x44);
          auVar70._16_16_ = auVar67;
          auVar70._0_16_ = auVar67;
          auVar71 = vorps_avx(auVar70,auVar51._0_32_);
          auVar70 = vorps_avx(auVar70,auVar53._0_32_);
          auVar73._0_8_ = auVar70._16_8_ ^ 0x8000000000000000;
          auVar73._8_4_ = auVar70._24_4_;
          auVar73._12_4_ = auVar70._28_4_ ^ 0x80000000;
          auVar67 = vpcmpgtq_avx(auVar73,auVar60);
          auVar75._0_8_ = uVar18 ^ 0x8000000000000000;
          auVar75._8_4_ = auVar60._8_4_;
          auVar75._12_4_ = uVar25 ^ 0x80000000;
          auVar69._0_8_ = auVar70._0_8_ ^ 0x8000000000000000;
          auVar69._8_4_ = auVar70._8_4_;
          auVar69._12_4_ = auVar70._12_4_ ^ 0x80000000;
          auVar69 = vpcmpgtq_avx(auVar69,auVar75);
          auVar67 = vpackssdw_avx(auVar69,auVar67);
          auVar74._0_8_ = auVar71._16_8_ ^ 0x8000000000000000;
          auVar74._8_4_ = auVar71._24_4_;
          auVar74._12_4_ = auVar71._28_4_ ^ 0x80000000;
          auVar69 = vpcmpgtq_avx(auVar74,auVar60);
          auVar76._0_8_ = uVar18 ^ 0x8000000000000000;
          auVar76._8_4_ = auVar60._8_4_;
          auVar76._12_4_ = uVar25 ^ 0x80000000;
          auVar72._0_8_ = auVar71._0_8_ ^ 0x8000000000000000;
          auVar72._8_4_ = auVar71._8_4_;
          auVar72._12_4_ = auVar71._12_4_ ^ 0x80000000;
          auVar72 = vpcmpgtq_avx(auVar72,auVar76);
          auVar69 = vpackssdw_avx(auVar72,auVar69);
          auVar67 = vpackssdw_avx(auVar69 ^ auVar44,auVar67 ^ auVar44);
          auVar69 = vpmovsxwd_avx(auVar67);
          auVar67 = vpunpckhwd_avx(auVar67,auVar67);
          auVar71._16_16_ = auVar67;
          auVar71._0_16_ = auVar69;
          auVar71 = vmaskmovps_avx(auVar71,auVar68);
          *(undefined1 (*) [32])((long)pvVar39 + uVar28 * 4) = auVar71;
          uVar28 = uVar28 + 8;
        } while ((uVar26 + 7 & 0xfffffff8) != uVar28);
      }
      if (0 < (int)uVar13) {
        pauVar41 = (undefined1 (*) [32])(sVar19 * sVar20 * lVar42 + (long)pvVar21);
        uVar28 = 0;
        lVar34 = (long)pvVar22 + lVar35 * 2 + 0x40;
        lVar37 = (long)pvVar22 + lVar35 + 0x40;
        lVar40 = (long)pvVar22 + 0x40;
        do {
          if (0 < (int)uVar15) {
            auVar68 = *pauVar41;
            auVar71 = pauVar41[1];
            auVar70 = pauVar41[2];
            auVar6 = pauVar41[3];
            auVar7 = pauVar41[4];
            auVar8 = pauVar41[5];
            auVar9 = pauVar41[6];
            auVar10 = pauVar41[7];
            auVar11 = pauVar41[8];
            uVar29 = 0;
            lVar31 = lVar40;
            lVar33 = lVar34;
            lVar36 = lVar37;
            pvVar43 = (void *)(lVar27 * lVar42 + (long)pvVar17);
            do {
              if (0 < iVar14) {
                lVar32 = 0;
                auVar62 = auVar61;
                auVar65 = auVar64;
                iVar38 = iVar14;
                do {
                  pfVar2 = (float *)(lVar31 + -0x40 + lVar32 * 8);
                  pfVar3 = (float *)(lVar31 + -0x20 + lVar32 * 8);
                  pfVar1 = (float *)(lVar31 + lVar32 * 8);
                  auVar66._0_4_ = auVar70._0_4_ * *pfVar1;
                  auVar66._4_4_ = auVar70._4_4_ * pfVar1[1];
                  auVar66._8_4_ = auVar70._8_4_ * pfVar1[2];
                  auVar66._12_4_ = auVar70._12_4_ * pfVar1[3];
                  auVar66._16_4_ = auVar70._16_4_ * pfVar1[4];
                  auVar66._20_4_ = auVar70._20_4_ * pfVar1[5];
                  auVar66._28_36_ = auVar65._28_36_;
                  auVar66._24_4_ = auVar70._24_4_ * pfVar1[6];
                  auVar64 = ZEXT3264(auVar66._0_32_);
                  pfVar4 = (float *)(lVar36 + -0x40 + lVar32 * 8);
                  pfVar5 = (float *)(lVar36 + -0x20 + lVar32 * 8);
                  pfVar1 = (float *)(lVar36 + lVar32 * 8);
                  auVar63._0_4_ = auVar8._0_4_ * *pfVar1;
                  auVar63._4_4_ = auVar8._4_4_ * pfVar1[1];
                  auVar63._8_4_ = auVar8._8_4_ * pfVar1[2];
                  auVar63._12_4_ = auVar8._12_4_ * pfVar1[3];
                  auVar63._16_4_ = auVar8._16_4_ * pfVar1[4];
                  auVar63._20_4_ = auVar8._20_4_ * pfVar1[5];
                  auVar63._28_36_ = auVar62._28_36_;
                  auVar63._24_4_ = auVar8._24_4_ * pfVar1[6];
                  auVar61 = ZEXT3264(auVar63._0_32_);
                  pfVar1 = (float *)(lVar33 + -0x40 + lVar32 * 8);
                  fVar23 = auVar53._28_4_;
                  auVar47._0_4_ =
                       auVar6._0_4_ * *pfVar4 + auVar68._0_4_ * *pfVar2 + auVar9._0_4_ * *pfVar1;
                  auVar47._4_4_ =
                       auVar6._4_4_ * pfVar4[1] + auVar68._4_4_ * pfVar2[1] +
                       auVar9._4_4_ * pfVar1[1];
                  auVar47._8_4_ =
                       auVar6._8_4_ * pfVar4[2] + auVar68._8_4_ * pfVar2[2] +
                       auVar9._8_4_ * pfVar1[2];
                  auVar47._12_4_ =
                       auVar6._12_4_ * pfVar4[3] + auVar68._12_4_ * pfVar2[3] +
                       auVar9._12_4_ * pfVar1[3];
                  auVar47._16_4_ =
                       auVar6._16_4_ * pfVar4[4] + auVar68._16_4_ * pfVar2[4] +
                       auVar9._16_4_ * pfVar1[4];
                  auVar47._20_4_ =
                       auVar6._20_4_ * pfVar4[5] + auVar68._20_4_ * pfVar2[5] +
                       auVar9._20_4_ * pfVar1[5];
                  auVar47._24_4_ =
                       auVar6._24_4_ * pfVar4[6] + auVar68._24_4_ * pfVar2[6] +
                       auVar9._24_4_ * pfVar1[6];
                  auVar47._28_4_ = auVar48._28_4_ + auVar51._28_4_ + 0.0;
                  pfVar1 = (float *)(lVar33 + -0x20 + lVar32 * 8);
                  auVar49._0_4_ =
                       auVar7._0_4_ * *pfVar5 + auVar71._0_4_ * *pfVar3 + auVar10._0_4_ * *pfVar1;
                  auVar49._4_4_ =
                       auVar7._4_4_ * pfVar5[1] + auVar71._4_4_ * pfVar3[1] +
                       auVar10._4_4_ * pfVar1[1];
                  auVar49._8_4_ =
                       auVar7._8_4_ * pfVar5[2] + auVar71._8_4_ * pfVar3[2] +
                       auVar10._8_4_ * pfVar1[2];
                  auVar49._12_4_ =
                       auVar7._12_4_ * pfVar5[3] + auVar71._12_4_ * pfVar3[3] +
                       auVar10._12_4_ * pfVar1[3];
                  auVar49._16_4_ =
                       auVar7._16_4_ * pfVar5[4] + auVar71._16_4_ * pfVar3[4] +
                       auVar10._16_4_ * pfVar1[4];
                  auVar49._20_4_ =
                       auVar7._20_4_ * pfVar5[5] + auVar71._20_4_ * pfVar3[5] +
                       auVar10._20_4_ * pfVar1[5];
                  auVar49._24_4_ =
                       auVar7._24_4_ * pfVar5[6] + auVar71._24_4_ * pfVar3[6] +
                       auVar10._24_4_ * pfVar1[6];
                  auVar49._28_4_ = auVar51._28_4_ + fVar23 + fVar23;
                  auVar47 = vhaddps_avx(auVar47,auVar49);
                  pfVar1 = (float *)(lVar33 + lVar32 * 8);
                  fVar52 = auVar11._0_4_ * *pfVar1;
                  fVar54 = auVar11._4_4_ * pfVar1[1];
                  fVar55 = auVar11._8_4_ * pfVar1[2];
                  fVar56 = auVar11._12_4_ * pfVar1[3];
                  fVar57 = auVar11._16_4_ * pfVar1[4];
                  fVar58 = auVar11._20_4_ * pfVar1[5];
                  fVar59 = auVar11._24_4_ * pfVar1[6];
                  auVar53 = ZEXT3264(CONCAT428(fVar23,CONCAT424(fVar59,CONCAT420(fVar58,CONCAT416(
                                                  fVar57,CONCAT412(fVar56,CONCAT48(fVar55,CONCAT44(
                                                  fVar54,fVar52))))))));
                  auVar50._0_4_ = auVar63._0_4_ + auVar66._0_4_ + fVar52;
                  auVar50._4_4_ = auVar63._4_4_ + auVar66._4_4_ + fVar54;
                  auVar50._8_4_ = auVar63._8_4_ + auVar66._8_4_ + fVar55;
                  auVar50._12_4_ = auVar63._12_4_ + auVar66._12_4_ + fVar56;
                  auVar50._16_4_ = auVar63._16_4_ + auVar66._16_4_ + fVar57;
                  auVar50._20_4_ = auVar63._20_4_ + auVar66._20_4_ + fVar58;
                  auVar50._24_4_ = auVar63._24_4_ + auVar66._24_4_ + fVar59;
                  auVar50._28_4_ = auVar62._28_4_ + auVar65._28_4_ + fVar23;
                  auVar49 = vhaddps_avx(auVar50,ZEXT1632(ZEXT816(0) << 0x40));
                  auVar47 = vhaddps_avx(auVar47,auVar49);
                  auVar45._0_4_ = auVar47._16_4_ + auVar47._0_4_;
                  auVar45._4_4_ = auVar47._20_4_ + auVar47._4_4_;
                  auVar45._8_4_ = auVar47._24_4_ + auVar47._8_4_;
                  auVar45._12_4_ = auVar47._28_4_ + auVar47._12_4_;
                  auVar44 = vshufpd_avx(auVar45,auVar45,1);
                  auVar46._0_4_ = auVar44._0_4_ + auVar45._0_4_;
                  auVar46._4_4_ = auVar44._4_4_ + auVar45._4_4_;
                  auVar46._8_4_ = auVar44._8_4_ + auVar45._8_4_;
                  auVar46._12_4_ = auVar44._12_4_ + auVar45._12_4_;
                  auVar44 = vmovshdup_avx(auVar46);
                  fVar23 = auVar44._0_4_ + *(float *)((long)pvVar43 + lVar32);
                  auVar51 = ZEXT464((uint)fVar23);
                  fVar23 = fVar23 + auVar46._0_4_;
                  auVar48 = ZEXT464((uint)fVar23);
                  *(float *)((long)pvVar43 + lVar32) = fVar23;
                  lVar32 = lVar32 + 4;
                  iVar38 = iVar38 + -1;
                  auVar62 = auVar61;
                  auVar65 = auVar64;
                } while (iVar38 != 0);
                pvVar43 = (void *)((long)pvVar43 + lVar32);
              }
              uVar29 = uVar29 + 1;
              lVar31 = lVar31 + lVar35;
              lVar36 = lVar36 + lVar35;
              lVar33 = lVar33 + lVar35;
            } while (uVar29 != uVar15);
          }
          auVar44 = auVar64._0_16_;
          pauVar41 = pauVar41 + 9;
          uVar28 = uVar28 + 1;
          lVar40 = lVar40 + lVar30;
          lVar37 = lVar37 + lVar30;
          lVar34 = lVar34 + lVar30;
        } while (uVar28 != uVar13);
      }
      lVar42 = lVar42 + 1;
      pvVar39 = (void *)((long)pvVar39 + lVar27);
      auVar51 = ZEXT3264(_DAT_0054fc80);
      auVar53 = ZEXT3264(_DAT_0054fca0);
      auVar44 = vpcmpeqd_avx(auVar44,auVar44);
    } while (lVar42 != iVar12);
  }
  return;
}

Assistant:

static void conv3x3s1_pack8to1_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* bias = _bias;

    int remain_outch_start = 0;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;
        out0.fill(bias0);

        const float* k0 = kernel.channel(p);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            __m256 _k00 = _mm256_loadu_ps(k0);
            __m256 _k01 = _mm256_loadu_ps(k0 + 8);
            __m256 _k02 = _mm256_loadu_ps(k0 + 16);
            __m256 _k10 = _mm256_loadu_ps(k0 + 24);
            __m256 _k11 = _mm256_loadu_ps(k0 + 32);
            __m256 _k12 = _mm256_loadu_ps(k0 + 40);
            __m256 _k20 = _mm256_loadu_ps(k0 + 48);
            __m256 _k21 = _mm256_loadu_ps(k0 + 56);
            __m256 _k22 = _mm256_loadu_ps(k0 + 64);

            int i = 0;

            for (; i < outh; i++)
            {
                const float* r0 = img0.row(i);
                const float* r1 = img0.row(i + 1);
                const float* r2 = img0.row(i + 2);
                int j = 0;
                for (; j < outw; j++)
                {
                    __m256 _r00 = _mm256_loadu_ps(r0);
                    __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                    __m256 _r02 = _mm256_loadu_ps(r0 + 16);

                    __m256 _sum0 = _mm256_mul_ps(_k00, _r00);
                    __m256 _sum1 = _mm256_mul_ps(_k01, _r01);
                    __m256 _sum2 = _mm256_mul_ps(_k02, _r02);

                    __m256 _r10 = _mm256_loadu_ps(r1);
                    __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                    __m256 _r12 = _mm256_loadu_ps(r1 + 16);

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum2 = _mm256_comp_fmadd_ps(_k12, _r12, _sum2);

                    __m256 _r20 = _mm256_loadu_ps(r2);
                    __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                    __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                    _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_k21, _r21, _sum1);
                    _sum2 = _mm256_comp_fmadd_ps(_k22, _r22, _sum2);
                    __m128 _sum = HorizontalSums(_sum0, _sum1, _sum2);

                    *outptr0 += _mm_reduce_add_ps(_sum); // dot
                    outptr0++;
                    r0 += 8;
                    r1 += 8;
                    r2 += 8;
                }
            }

            k0 += 9 * 8;
        }
    }
}